

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

int32_t conv_mcnp6_ssw2pdg(int32_t c)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (-1 < c) {
    uVar1 = (uint)c >> 1 & 0x3f;
    if (uVar1 < 0x25) {
      iVar4 = conv_mcnp6_to_pdg_0to36[uVar1];
      iVar3 = -iVar4;
      if (uVar1 == 2) {
        iVar3 = iVar4;
      }
LAB_0010353d:
      if ((c & 1U) == 0) {
        iVar3 = iVar4;
      }
      return iVar3;
    }
    if (uVar1 == 0x25) {
      uVar1 = (uint)c >> 7 & 0x1ff;
      uVar2 = (uint)c >> 0x10 & 0x7f;
      if ((uVar2 != 0 && uVar1 != 0) && ((uint)c < 0x5000000 && uVar2 <= uVar1)) {
        iVar3 = uVar2 * 10000 + ((uint)c >> 0x17);
        iVar4 = iVar3 + uVar1 * 10 + 1000000000;
        iVar3 = -1000000000 - (iVar3 + uVar1 * 10);
        goto LAB_0010353d;
      }
    }
  }
  return 0;
}

Assistant:

int32_t conv_mcnp6_ssw2pdg( int32_t c )
{
  if (c<0)
    return 0;
  int antibit = c%2;  c /=  2;
  int ptype = c%64;  c /=  64;

  if (ptype<=36) {
    //Note that A (see below) has been observed in SSW files to have non-zero
    //values for ptype<37 as well, so don't require A, Z or S to be 0 here.
    int32_t p = conv_mcnp6_to_pdg_0to36[ptype];
    return (antibit&&p!=22) ? -p : p;
  }
  if (ptype==37) {
    int A = c%512;  c /=  512;
    int Z = c%128;  c /=  128;
    int S = c;
    if (A<1||Z<1||A<Z||S>9)
      return 0;
    int32_t p = 1000000000 + 10000*Z + 10*A + S;
    return antibit ? -p : p;
  }
  return 0;
}